

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diy_fp.h
# Opt level: O3

pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
 floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>::boundaries(float d)

{
  uint uVar1;
  pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
  pVar2;
  uint uVar3;
  int iVar4;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> local_18;
  
  uVar3 = (uint)d >> 0x17 & 0xff;
  uVar1 = (uint)d & 0x7fffff | 0x800000;
  if (uVar3 == 0) {
    uVar1 = (uint)d & 0x7fffff;
  }
  iVar4 = -0x95;
  if (uVar3 != 0) {
    iVar4 = uVar3 - 0x96;
  }
  local_18.m_f = uVar1 * 2 + 1;
  local_18.m_e = iVar4 + -1;
  normalize_from_ieee754(&local_18);
  pVar2.first.m_e = local_18.m_e;
  pVar2.first.m_f =
       (uVar1 << (uVar1 == 0x800000) + 1) + -1 <<
       ((char)iVar4 - ((uVar1 == 0x800000) + (char)local_18.m_e + '\x01') & 0x1fU);
  pVar2.second.m_f = local_18.m_f;
  pVar2.second.m_e = local_18.m_e;
  return pVar2;
}

Assistant:

static std::pair<diy_fp, diy_fp> boundaries(FloatType d) noexcept
		{
			std::pair<diy_fp, diy_fp> result;
			diy_fp &mi(result.first), &pl(result.second);
			pl = diy_fp(d);
			mi = pl;

			pl.m_f <<= 1;
			pl.m_f += 1;

			pl.m_e  -= 1;


			pl.normalize_from_ieee754(); // as we increase precision of IEEE-754 type by 1

			const unsigned char shift_amount(1 + (mi.m_f == hidden_bit()));

			mi.m_f <<= shift_amount;
			mi.m_f -= 1;
			mi.m_e -= shift_amount;

			mi.m_f <<= mi.m_e - pl.m_e;
			mi.m_e = pl.m_e;

			return result;
		}